

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::EmitScopeObjectInit(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ushort uVar1;
  uint lhs;
  int iVar2;
  ParseNode *pPVar3;
  code *pcVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  FunctionBody *pFVar8;
  undefined4 *puVar9;
  PropertyIdArray *pPVar10;
  Symbol *pSVar11;
  ParseNodePtr pPVar12;
  ParseNodeFnc *pPVar13;
  ParseNodeVar *pPVar14;
  ParseNodePtr *ppPVar15;
  ulong uVar16;
  int iVar17;
  anon_class_32_4_e369621f local_a8;
  anon_class_8_1_3fcf6586 local_88;
  long local_80;
  FuncInfo *local_78;
  Scope *local_70;
  PropertyIdArray *local_68;
  ByteCodeGenerator *local_60;
  ulong local_58;
  uint local_50;
  PropertyId local_4c;
  uint cachedFuncCount;
  PropertyId firstFuncSlot;
  PropertyIdArray *local_40;
  PropertyIdArray *propIds;
  PropertyId firstVarSlot;
  
  pFVar8 = Js::FunctionProxy::GetFunctionBody(&funcInfo->byteCodeFunction->super_FunctionProxy);
  if (((pFVar8->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x627,
                       "(!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc())",
                       "!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc()");
    if (!bVar5) goto LAB_0075d070;
    *puVar9 = 0;
  }
  if ((funcInfo->field_0xb5 & 1) != 0) {
    local_70 = funcInfo->currentChildScope;
    lhs = local_70->scopeSlotCount;
    uVar16 = (ulong)lhs;
    local_50 = 0;
    local_4c = -1;
    propIds._4_4_ = 0xffffffff;
    uVar6 = UInt32Math::Add(lhs,4);
    if (0x3fffffff < uVar6) {
      Math::DefaultOverflowPolicy();
    }
    pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
    pPVar10 = Js::FunctionBody::AllocatePropertyIdArrayForFormals(pFVar8,uVar6 << 2,lhs,'\x04');
    pPVar13 = funcInfo->root;
    local_40 = pPVar10;
    if ((funcInfo->field_0xb5 & 2) != 0) {
      pSVar11 = ParseNodeFnc::GetFuncSymbol(pPVar13);
      if (pSVar11->scope == funcInfo->bodyScope) {
        pSVar11 = ParseNodeFnc::GetFuncSymbol(pPVar13);
        Symbol::SaveToPropIdArray(pSVar11,pPVar10,this,(PropertyId *)0x0);
      }
    }
    local_58 = uVar16;
    _cachedFuncCount = pPVar13;
    if ((funcInfo->field_0xb4 & 8) == 0) {
      local_a8.propIds = &local_40;
      local_a8.this = this;
      for (pPVar12 = pPVar13->pnodeParams; pPVar12 != (ParseNode *)0x0;
          pPVar12 = ParseNode::GetFormalNext(pPVar12)) {
        EmitScopeObjectInit::anon_class_16_2_43e5d7e0::operator()
                  ((anon_class_16_2_43e5d7e0 *)&local_a8,pPVar12);
      }
      if (_cachedFuncCount->pnodeRest != (ParseNode *)0x0) {
        EmitScopeObjectInit::anon_class_16_2_43e5d7e0::operator()
                  ((anon_class_16_2_43e5d7e0 *)&local_a8,_cachedFuncCount->pnodeRest);
      }
    }
    else {
      pPVar12 = pPVar13->pnodeParams;
      iVar17 = 0;
      local_78 = funcInfo;
      local_60 = this;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      local_68 = pPVar10;
      for (; uVar16 = local_58, this = local_60, funcInfo = local_78, pPVar12 != (ParseNode *)0x0;
          pPVar12 = ParseNode::GetFormalNext(pPVar12)) {
        if ((byte)(pPVar12->nop + ~knopList) < 3) {
          local_80 = (long)iVar17;
          pPVar14 = ParseNode::AsParseNodeVar(pPVar12);
          pSVar11 = pPVar14->sym;
          if (pSVar11 == (Symbol *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x64d,"(sym)","sym");
            if (!bVar5) goto LAB_0075d070;
            *puVar9 = 0;
            pPVar10 = local_68;
          }
          pPVar13 = _cachedFuncCount;
          iVar2 = pSVar11->scopeSlot;
          if (iVar17 == iVar2) {
            Symbol::SaveToPropIdArray(pSVar11,pPVar10,local_60,(PropertyId *)0x0);
            pPVar13 = _cachedFuncCount;
          }
          else {
            if (iVar2 == -1 || iVar2 <= iVar17) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x657,
                                 "(sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot)"
                                 ,
                                 "sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot"
                                );
              if (!bVar5) goto LAB_0075d070;
              *puVar9 = 0;
              pPVar10 = local_68;
            }
            (&pPVar10[1].count)[local_80] = 0xffffffff;
          }
        }
        else {
          (&pPVar10[1].count)[iVar17] = 0xffffffff;
        }
        iVar17 = iVar17 + 1;
      }
      pPVar3 = pPVar13->pnodeRest;
      if ((pPVar3 != (ParseNode *)0x0) && ((byte)(pPVar3->nop + ~knopList) < 3)) {
        pPVar14 = ParseNode::AsParseNodeVar(pPVar3);
        pSVar11 = pPVar14->sym;
        bVar5 = Symbol::IsInSlot(pSVar11,this,funcInfo,false);
        if (bVar5) {
          Symbol::SaveToPropIdArray(pSVar11,local_40,this,(PropertyId *)0x0);
        }
      }
    }
    local_a8.propIds = &local_40;
    local_a8.firstFuncSlot = &local_4c;
    local_a8.cachedFuncCount = &local_50;
    local_a8.this = this;
    pPVar13 = ParseNode::AsParseNodeFnc(&_cachedFuncCount->super_ParseNode);
    local_88.fn = &local_a8;
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1658:42)>
    ::anon_class_8_1_3fcf6586::operator()(&local_88,pPVar13->pnodeScopes->pnodeScopes);
    if (pPVar13->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1658:42)>
      ::anon_class_8_1_3fcf6586::operator()(&local_88,pPVar13->pnodeBodyScope->pnodeScopes);
    }
    if (local_70->scopeType == ScopeType_Parameter) {
      if ((funcInfo->field_0xb5 & 0x80) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x6bc,"(!funcInfo->IsBodyAndParamScopeMerged())",
                           "!funcInfo->IsBodyAndParamScopeMerged()");
        if (!bVar5) {
LAB_0075d070:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
    }
    else {
      ppPVar15 = &_cachedFuncCount->pnodeVars;
      while (uVar16 = local_58, pPVar3 = *ppPVar15, pPVar3 != (ParseNode *)0x0) {
        pPVar14 = ParseNode::AsParseNodeVar(pPVar3);
        pSVar11 = pPVar14->sym;
        pPVar14 = ParseNode::AsParseNodeVar(pPVar3);
        uVar1 = *(ushort *)&pSVar11->field_0x42;
        if ((pPVar14->isBlockScopeFncDeclVar == '\0') || ((uVar1 & 2) == 0)) {
          if (((uVar1 & 0x40) != 0) || (((uVar1 & 2) != 0 && (pPVar3->nop == knopVarDecl)))) {
            pSVar11 = Scope::FindLocalSymbol(local_70,&pSVar11->name);
          }
          Symbol::SaveToPropIdArray(pSVar11,local_40,this,(PropertyId *)((long)&propIds + 4));
        }
        pPVar14 = ParseNode::AsParseNodeVar(pPVar3);
        ppPVar15 = &pPVar14->pnodeNext;
      }
      ppPVar15 = &_cachedFuncCount->pnodeScopes->pnodeLexVars;
      while (pPVar3 = *ppPVar15, pPVar3 != (ParseNode *)0x0) {
        pPVar14 = ParseNode::AsParseNodeVar(pPVar3);
        Symbol::SaveToPropIdArray(pPVar14->sym,local_40,this,(PropertyId *)((long)&propIds + 4));
        pPVar14 = ParseNode::AsParseNodeVar(pPVar3);
        ppPVar15 = &pPVar14->pnodeNext;
      }
      ppPVar15 = &_cachedFuncCount->pnodeBodyScope->pnodeLexVars;
      while (pPVar3 = *ppPVar15, pPVar3 != (ParseNode *)0x0) {
        pPVar14 = ParseNode::AsParseNodeVar(pPVar3);
        Symbol::SaveToPropIdArray(pPVar14->sym,local_40,this,(PropertyId *)((long)&propIds + 4));
        pPVar14 = ParseNode::AsParseNodeVar(pPVar3);
        ppPVar15 = &pPVar14->pnodeNext;
      }
    }
    pPVar10 = local_40;
    (&local_40[1].count)[uVar16] = local_50;
    *(PropertyId *)(&local_40[1].extraSlots + uVar16 * 4) = local_4c;
    (&local_40[2].count)[uVar16] = propIds._4_4_;
    pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
    uVar7 = Js::FunctionBody::NewObjectLiteral(pFVar8);
    *(uint *)(&pPVar10[2].extraSlots + uVar16 * 4) = uVar7;
    local_40->hasNonSimpleParams = (Type)((byte)(funcInfo->root->fncFlags >> 0xf) & 1);
    pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
    pFVar8->hasCachedScopePropIds = true;
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitScopeObjectInit(FuncInfo *funcInfo)
{
    Assert(!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc());

    if (!funcInfo->GetHasCachedScope() /* || forcing scope/inner func caching */)
    {
        return;
    }

    Scope* currentScope = funcInfo->GetCurrentChildScope();
    uint slotCount = currentScope->GetScopeSlotCount();
    uint cachedFuncCount = 0;
    Js::PropertyId firstFuncSlot = Js::Constants::NoProperty;
    Js::PropertyId firstVarSlot = Js::Constants::NoProperty;

    uint extraAlloc = UInt32Math::Add(slotCount, Js::ActivationObjectEx::ExtraSlotCount());
    extraAlloc = UInt32Math::Mul(extraAlloc, sizeof(Js::PropertyId));

    // Create and fill the array of local property ID's.
    // They all have slots assigned to them already (if they need them): see StartEmitFunction.

    Js::PropertyIdArray *propIds = funcInfo->GetParsedFunctionBody()->AllocatePropertyIdArrayForFormals(extraAlloc, slotCount, Js::ActivationObjectEx::ExtraSlotCount());

    ParseNodeFnc *pnodeFnc = funcInfo->root;

    if (funcInfo->GetFuncExprNameReference() && pnodeFnc->GetFuncSymbol()->GetScope() == funcInfo->GetBodyScope())
    {
        Symbol::SaveToPropIdArray(pnodeFnc->GetFuncSymbol(), propIds, this);
    }

    if (funcInfo->GetHasArguments())
    {
        // Because the arguments object can access all instances of same-named formals ("function(x,x){...}"),
        // be sure we initialize any duplicate appearances of a formal parameter to "NoProperty".
        Js::PropertyId slot = 0;
        auto initArg = [&](ParseNode *pnode)
        {
            if (pnode->IsVarLetOrConst())
            {
                Symbol *sym = pnode->AsParseNodeVar()->sym;
                Assert(sym);
                if (sym->GetScopeSlot() == slot)
                {
                    // This is the last appearance of the formal, so record the ID.
                    Symbol::SaveToPropIdArray(sym, propIds, this);
                }
                else
                {
                    // This is an earlier duplicate appearance of the formal, so use NoProperty as a placeholder
                    // since this slot can't be accessed by name.
                    Assert(sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot);
                    propIds->elements[slot] = Js::Constants::NoProperty;
                }
            }
            else
            {
                // This is for patterns
                propIds->elements[slot] = Js::Constants::NoProperty;
            }
            slot++;
        };
        MapFormalsWithoutRest(pnodeFnc, initArg);

        ParseNodePtr rest = pnodeFnc->pnodeRest;
        if (rest != nullptr && rest->IsVarLetOrConst())
        {
            // If the rest is in the slot - we need to keep that slot.
            Symbol *sym = rest->AsParseNodeVar()->sym;
            if (sym->IsInSlot(this, funcInfo))
            {
                Symbol::SaveToPropIdArray(sym, propIds, this);
            }
        }
    }
    else
    {
        MapFormals(pnodeFnc, [&](ParseNode *pnode)
        {
            if (pnode->IsVarLetOrConst())
            {
                Symbol::SaveToPropIdArray(pnode->AsParseNodeVar()->sym, propIds, this);
            }
        });
    }

    auto saveFunctionVarsToPropIdArray = [&](ParseNode *pnodeFunction)
    {
        if (pnodeFunction->AsParseNodeFnc()->IsDeclaration())
        {
            ParseNode *pnodeName = pnodeFunction->AsParseNodeFnc()->pnodeName;
            if (pnodeName != nullptr)
            {
                while (pnodeName->nop == knopList)
                {
                    if (pnodeName->AsParseNodeBin()->pnode1->nop == knopVarDecl)
                    {
                        Symbol *sym = pnodeName->AsParseNodeBin()->pnode1->AsParseNodeVar()->sym;
                        if (sym)
                        {
                            Symbol::SaveToPropIdArray(sym, propIds, this, &firstFuncSlot);
                        }
                    }
                    pnodeName = pnodeName->AsParseNodeBin()->pnode2;
                }
                if (pnodeName->nop == knopVarDecl)
                {
                    Symbol *sym = pnodeName->AsParseNodeVar()->sym;
                    if (sym)
                    {
                        Symbol::SaveToPropIdArray(sym, propIds, this, &firstFuncSlot);
                        cachedFuncCount++;
                    }
                }
            }
        }
    };
    MapContainerScopeFunctions(pnodeFnc, saveFunctionVarsToPropIdArray);

    if (currentScope->GetScopeType() != ScopeType_Parameter)
    {
        ParseNode *pnode;
        Symbol *sym;
        for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
            {
                if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                {
                    sym = currentScope->FindLocalSymbol(sym->GetName());
                }
                Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
            }
        }

        ParseNodeBlock *pnodeBlock = pnodeFnc->pnodeScopes;
        for (pnode = pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
        }

        pnodeBlock = pnodeFnc->pnodeBodyScope;
        for (pnode = pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
        }
    }
    else
    {
        Assert(!funcInfo->IsBodyAndParamScopeMerged());
    }

    // Write the first func slot and first var slot into the auxiliary data
    Js::PropertyId *slots = propIds->elements + slotCount;
    slots[0] = cachedFuncCount;
    slots[1] = firstFuncSlot;
    slots[2] = firstVarSlot;
    slots[3] = funcInfo->GetParsedFunctionBody()->NewObjectLiteral();

    propIds->hasNonSimpleParams = funcInfo->root->HasNonSimpleParameterList();

    funcInfo->GetParsedFunctionBody()->SetHasCachedScopePropIds(true);
}